

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

void __thiscall wasm::Type::Type(Type *this,HeapType heapType,Nullability nullable,Exactness exact)

{
  this->id = (uint)(exact == Exact) * 4 + (uint)(nullable == Nullable) * 2 | heapType.id;
  if (((uint)(0x7c < heapType.id) * 4 + 3 & (uint)heapType.id) != 0) {
    __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
  }
  if (exact == Inexact || 0x7c < heapType.id) {
    return;
  }
  __assert_fail("!heapType.isBasic() || exact == Inexact",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14d,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

Type(HeapType heapType, Nullability nullable, Exactness exact = Inexact)
    : Type(heapType.getID() | (nullable == Nullable ? NullMask : 0) |
           (exact == Exact ? ExactMask : 0)) {
    assert(!(heapType.getID() &
             (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask))));
    assert(!heapType.isBasic() || exact == Inexact);
  }